

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void ParseStructLabel(CStructure *st)

{
  bool bVar1;
  char p;
  int iVar2;
  byte *pbVar3;
  char temp [2048];
  byte local_828 [2056];
  
  pbVar3 = local_828;
  if (PreviousIsLabel != (char *)0x0) {
    free(PreviousIsLabel);
    PreviousIsLabel = (char *)0x0;
  }
  bVar1 = White();
  if (!bVar1) {
    if (*lp == '.') {
      lp = lp + 1;
    }
    p = *lp;
    while (p != '\0') {
      iVar2 = islabchar(p);
      if (iVar2 == 0) break;
      *pbVar3 = *lp;
      pbVar3 = (byte *)((char *)pbVar3 + 1);
      p = lp[1];
      lp = lp + 1;
    }
    *pbVar3 = '\0';
    if (*lp == ':') {
      lp = lp + 1;
    }
    SkipBlanks();
    if (local_828[0] - 0x30 < 10) {
      Error("[STRUCT] Number labels not allowed within structs",(char *)0x0,PASS3);
      return;
    }
    PreviousIsLabel = strdup((char *)local_828);
    if (PreviousIsLabel == (char *)0x0) {
      ErrorOOM();
    }
    CStructure::AddLabel(st,(char *)local_828);
  }
  return;
}

Assistant:

void ParseStructLabel(CStructure* st) {
	char* tp, temp[LINEMAX];
	if (PreviousIsLabel) {
		free(PreviousIsLabel);
		PreviousIsLabel = nullptr;
	}
	if (White()) {
		return;
	}
	tp = temp;
	if (*lp == '.') {
		++lp;
	}
	while (*lp && islabchar(*lp)) {
		*tp = *lp; ++tp; ++lp;
	}
	*tp = 0;
	if (*lp == ':') {
		++lp;
	}
	tp = temp; SkipBlanks();
	if (isdigit((byte)*tp)) {
		Error("[STRUCT] Number labels not allowed within structs"); return;
	}
	PreviousIsLabel = STRDUP(tp);
	if (PreviousIsLabel == NULL) ErrorOOM();
	st->AddLabel(tp);
}